

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Own<capnp::ClientHook> __thiscall capnp::_::PointerReader::getCapability(PointerReader *this)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 uVar3;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  char *pcVar4;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar5;
  long in_RSI;
  Own<capnp::ClientHook> OVar6;
  Fault f;
  Fault local_20;
  CapTableReader *local_18;
  
  if (brokenCapFactory == (long *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[192]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
               ,0x893,FAILED,"brokenCapFactory != nullptr",
               "\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
               ,(char (*) [192])
                "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
              );
    kj::_::Debug::Fault::fatal(&local_20);
  }
  piVar2 = &(anonymous_namespace)::zero;
  if (*(int **)(in_RSI + 0x10) != (int *)0x0) {
    piVar2 = *(int **)(in_RSI + 0x10);
  }
  if (piVar2[1] == 0 && *piVar2 == 0) {
    (**(code **)(*brokenCapFactory + 8))(this,brokenCapFactory);
    pCVar5 = extraout_RDX_00;
  }
  else {
    if (*piVar2 == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 8))(&local_20,*(undefined8 **)(in_RSI + 8),piVar2[1]);
      if (local_18 != (CapTableReader *)0x0) {
        this->segment = (SegmentReader *)local_20.exception;
        this->capTable = local_18;
        pCVar5 = extraout_RDX;
        goto LAB_003ed4c0;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8a1,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                 (char (*) [45])"Message contains invalid capability pointer.");
      kj::_::Debug::Fault::~Fault(&local_20);
      puVar1 = (undefined8 *)*brokenCapFactory;
      pcVar4 = "Calling invalid capability pointer.";
      uVar3 = 0x24;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[79]>
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x899,FAILED,(char *)0x0,
                 "\"Message contains non-capability pointer where capability pointer was expected.\""
                 ,(char (*) [79])
                  "Message contains non-capability pointer where capability pointer was expected.");
      kj::_::Debug::Fault::~Fault(&local_20);
      puVar1 = (undefined8 *)*brokenCapFactory;
      pcVar4 = "Calling capability extracted from a non-capability pointer.";
      uVar3 = 0x3c;
    }
    (*(code *)*puVar1)(this,brokenCapFactory,pcVar4,uVar3);
    pCVar5 = extraout_RDX_01;
  }
LAB_003ed4c0:
  OVar6.ptr = pCVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

static KJ_ALWAYS_INLINE(kj::Own<ClientHook> readCapabilityPointer(
      SegmentReader* segment, CapTableReader* capTable,
      const WirePointer* ref, int nestingLimit)) {
    kj::Maybe<kj::Own<ClientHook>> maybeCap;

    KJ_REQUIRE(brokenCapFactory != nullptr,
               "Trying to read capabilities without ever having created a capability context.  "
               "To read capabilities from a message, you must imbue it with CapReaderContext, or "
               "use the Cap'n Proto RPC system.");

    if (ref->isNull()) {
      return brokenCapFactory->newNullCap();
    } else if (!ref->isCapability()) {
      KJ_FAIL_REQUIRE(
          "Message contains non-capability pointer where capability pointer was expected.") {
        break;
      }
      return brokenCapFactory->newBrokenCap(
          "Calling capability extracted from a non-capability pointer.");
    } else KJ_IF_MAYBE(cap, capTable->extractCap(ref->capRef.index.get())) {
      return kj::mv(*cap);
    } else {
      KJ_FAIL_REQUIRE("Message contains invalid capability pointer.") {
        break;
      }